

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateFormatSymbols::getQuarters
          (DateFormatSymbols *this,int32_t *count,DtContextType context,DtWidthType width)

{
  UnicodeString *local_28;
  UnicodeString *returnValue;
  DtWidthType width_local;
  DtContextType context_local;
  int32_t *count_local;
  DateFormatSymbols *this_local;
  
  local_28 = (UnicodeString *)0x0;
  if (context == FORMAT) {
    switch(width) {
    case ABBREVIATED:
    case SHORT:
      *count = this->fShortQuartersCount;
      local_28 = this->fShortQuarters;
      break;
    case WIDE:
      *count = this->fQuartersCount;
      local_28 = this->fQuarters;
      break;
    case NARROW:
      *count = 0;
      local_28 = (UnicodeString *)0x0;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  else if (context == STANDALONE) {
    switch(width) {
    case ABBREVIATED:
    case SHORT:
      *count = this->fStandaloneShortQuartersCount;
      local_28 = this->fStandaloneShortQuarters;
      break;
    case WIDE:
      *count = this->fStandaloneQuartersCount;
      local_28 = this->fStandaloneQuarters;
      break;
    case NARROW:
      *count = 0;
      local_28 = (UnicodeString *)0x0;
      break;
    case DT_WIDTH_COUNT:
    }
  }
  return local_28;
}

Assistant:

const UnicodeString*
DateFormatSymbols::getQuarters(int32_t &count, DtContextType context, DtWidthType width ) const
{
    UnicodeString *returnValue = NULL;

    switch (context) {
    case FORMAT :
        switch(width) {
        case WIDE :
            count = fQuartersCount;
            returnValue = fQuarters;
            break;
        case ABBREVIATED :
        case SHORT : // no quarter data for this, defaults to ABBREVIATED
            count = fShortQuartersCount;
            returnValue = fShortQuarters;
            break;
        case NARROW :
            count = 0;
            returnValue = NULL;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case STANDALONE :
        switch(width) {
        case WIDE :
            count = fStandaloneQuartersCount;
            returnValue = fStandaloneQuarters;
            break;
        case ABBREVIATED :
        case SHORT : // no quarter data for this, defaults to ABBREVIATED
            count = fStandaloneShortQuartersCount;
            returnValue = fStandaloneShortQuarters;
            break;
        case NARROW :
            count = 0;
            returnValue = NULL;
            break;
        case DT_WIDTH_COUNT :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
    return returnValue;
}